

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void absl::lts_20250127::ClearLogBacktraceLocation(void)

{
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (anonymous_namespace)::log_backtrace_at_hash = 0;
  return;
}

Assistant:

void ClearLogBacktraceLocation() {
  log_backtrace_at_hash.store(0, std::memory_order_relaxed);
}